

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

uint Abc_NtkPowerCriticalEdges(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,float Limit,Vec_Int_t *vProbs)

{
  int *piVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int local_40;
  uint local_3c;
  int k;
  uint uResult;
  float *pProb;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vProbs_local;
  float Limit_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtk_local;
  
  piVar1 = vProbs->pArray;
  local_3c = 0;
  for (local_40 = 0; iVar2 = Abc_ObjFaninNum(pNode), local_40 < iVar2; local_40 = local_40 + 1) {
    pAVar3 = Abc_ObjFanin(pNode,local_40);
    if (Limit <= (float)piVar1[pAVar3->Id]) {
      local_3c = 1 << ((byte)local_40 & 0x1f) | local_3c;
    }
  }
  return local_3c;
}

Assistant:

unsigned Abc_NtkPowerCriticalEdges( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, float Limit, Vec_Int_t * vProbs )
{
    Abc_Obj_t * pFanin;
    float * pProb = (float *)vProbs->pArray;
    unsigned uResult = 0;
    int k;
    Abc_ObjForEachFanin( pNode, pFanin, k )
        if ( pProb[pFanin->Id] >= Limit )
            uResult |= (1 << k);
    return uResult;
}